

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O0

Gia_Man_t * Gia_ManFOFUnfold(Gia_Man_t *p,Vec_Int_t *vMap)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Gia_Man_t *p_00;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  Gia_Man_t *p_01;
  bool bVar7;
  int local_50;
  int iFuncVars;
  int iMuxB;
  int iMuxA;
  int iCtrl3;
  int iCtrl2;
  int iCtrl1;
  int iCtrl0;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Vec_Int_t *vMap_local;
  Gia_Man_t *p_local;
  
  local_50 = 0;
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1 * 9);
  pcVar5 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar5;
  Gia_ManHashAlloc(p_00);
  pGVar6 = Gia_ManConst0(p);
  pGVar6->Value = 0;
  iCtrl1 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar7 = false;
    if (iCtrl1 < iVar1) {
      _iCtrl0 = Gia_ManCi(p,iCtrl1);
      bVar7 = _iCtrl0 != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    uVar2 = Gia_ManAppendCi(p_00);
    _iCtrl0->Value = uVar2;
    iCtrl1 = iCtrl1 + 1;
  }
  iCtrl1 = 0;
  while( true ) {
    bVar7 = false;
    if (iCtrl1 < p->nObjs) {
      _iCtrl0 = Gia_ManObj(p,iCtrl1);
      bVar7 = _iCtrl0 != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar1 = Gia_ObjIsAnd(_iCtrl0);
    if (iVar1 != 0) {
      iVar1 = Vec_IntEntry(vMap,local_50);
      if (iVar1 == 0) {
        iCtrl2 = 0;
        Gia_ManAppendCi(p_00);
      }
      else {
        iCtrl2 = Gia_ManAppendCi(p_00);
      }
      iVar1 = Vec_IntEntry(vMap,local_50 + 1);
      if (iVar1 == 0) {
        iCtrl3 = 0;
        Gia_ManAppendCi(p_00);
      }
      else {
        iCtrl3 = Gia_ManAppendCi(p_00);
      }
      iVar1 = local_50 + 3;
      iVar3 = Vec_IntEntry(vMap,local_50 + 2);
      if (iVar3 == 0) {
        iMuxA = 0;
        Gia_ManAppendCi(p_00);
      }
      else {
        iMuxA = Gia_ManAppendCi(p_00);
      }
      local_50 = local_50 + 4;
      iVar1 = Vec_IntEntry(vMap,iVar1);
      if (iVar1 == 0) {
        iMuxB = 0;
        Gia_ManAppendCi(p_00);
      }
      else {
        iMuxB = Gia_ManAppendCi(p_00);
      }
      iVar1 = Gia_ObjFaninC0(_iCtrl0);
      if ((iVar1 == 0) || (iVar1 = Gia_ObjFaninC1(_iCtrl0), iVar1 == 0)) {
        iVar1 = Gia_ObjFaninC0(_iCtrl0);
        if ((iVar1 == 0) && (iVar1 = Gia_ObjFaninC1(_iCtrl0), iVar1 != 0)) {
          iCtrl3 = Abc_LitNot(iCtrl3);
        }
        else {
          iVar1 = Gia_ObjFaninC0(_iCtrl0);
          if ((iVar1 == 0) || (iVar1 = Gia_ObjFaninC1(_iCtrl0), iVar1 != 0)) {
            iMuxB = Abc_LitNot(iMuxB);
          }
          else {
            iMuxA = Abc_LitNot(iMuxA);
          }
        }
      }
      else {
        iCtrl2 = Abc_LitNot(iCtrl2);
      }
      pGVar6 = Gia_ObjFanin0(_iCtrl0);
      iVar1 = Gia_ManHashMux(p_00,pGVar6->Value,iCtrl3,iCtrl2);
      pGVar6 = Gia_ObjFanin0(_iCtrl0);
      iVar3 = Gia_ManHashMux(p_00,pGVar6->Value,iMuxB,iMuxA);
      pGVar6 = Gia_ObjFanin1(_iCtrl0);
      uVar2 = Gia_ManHashMux(p_00,pGVar6->Value,iVar3,iVar1);
      _iCtrl0->Value = uVar2;
    }
    iCtrl1 = iCtrl1 + 1;
  }
  iVar1 = Vec_IntSize(vMap);
  if (local_50 == iVar1) {
    iCtrl1 = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCos);
      bVar7 = false;
      if (iCtrl1 < iVar1) {
        _iCtrl0 = Gia_ManCo(p,iCtrl1);
        bVar7 = _iCtrl0 != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      iVar1 = Gia_ObjFanin0Copy(_iCtrl0);
      uVar2 = Gia_ManAppendCo(p_00,iVar1);
      _iCtrl0->Value = uVar2;
      iCtrl1 = iCtrl1 + 1;
    }
    p_01 = Gia_ManCleanup(p_00);
    Gia_ManStop(p_00);
    iVar1 = Gia_ManPiNum(p_01);
    iVar3 = Gia_ManCiNum(p);
    iVar4 = Gia_ManAndNum(p);
    if (iVar1 != iVar3 + iVar4 * 4) {
      __assert_fail("Gia_ManPiNum(pNew) == Gia_ManCiNum(p) + 4 * Gia_ManAndNum(p)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                    ,0x20d,"Gia_Man_t *Gia_ManFOFUnfold(Gia_Man_t *, Vec_Int_t *)");
    }
    return p_01;
  }
  __assert_fail("iFuncVars == Vec_IntSize(vMap)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                ,0x208,"Gia_Man_t *Gia_ManFOFUnfold(Gia_Man_t *, Vec_Int_t *)");
}

Assistant:

Gia_Man_t * Gia_ManFOFUnfold( Gia_Man_t * p, Vec_Int_t * vMap )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, iCtrl0, iCtrl1, iCtrl2, iCtrl3, iMuxA, iMuxB, iFuncVars = 0;
    pNew = Gia_ManStart( 9 * Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( Vec_IntEntry(vMap, iFuncVars++) )
            iCtrl0 = Gia_ManAppendCi(pNew);
        else
            iCtrl0 = 0, Gia_ManAppendCi(pNew);

        if ( Vec_IntEntry(vMap, iFuncVars++) )
            iCtrl1 = Gia_ManAppendCi(pNew);
        else
            iCtrl1 = 0, Gia_ManAppendCi(pNew);

        if ( Vec_IntEntry(vMap, iFuncVars++) )
            iCtrl2 = Gia_ManAppendCi(pNew);
        else
            iCtrl2 = 0, Gia_ManAppendCi(pNew);

        if ( Vec_IntEntry(vMap, iFuncVars++) )
            iCtrl3 = Gia_ManAppendCi(pNew);
        else
            iCtrl3 = 0, Gia_ManAppendCi(pNew);

        if ( Gia_ObjFaninC0(pObj) && Gia_ObjFaninC1(pObj) )
            iCtrl0 = Abc_LitNot(iCtrl0);
        else if ( !Gia_ObjFaninC0(pObj) && Gia_ObjFaninC1(pObj) )
            iCtrl1 = Abc_LitNot(iCtrl1);
        else if ( Gia_ObjFaninC0(pObj) && !Gia_ObjFaninC1(pObj) )
            iCtrl2 = Abc_LitNot(iCtrl2);
        else //if ( !Gia_ObjFaninC0(pObj) && !Gia_ObjFaninC1(pObj) )
            iCtrl3 = Abc_LitNot(iCtrl3);

        iMuxA       = Gia_ManHashMux( pNew, Gia_ObjFanin0(pObj)->Value, iCtrl1, iCtrl0 );
        iMuxB       = Gia_ManHashMux( pNew, Gia_ObjFanin0(pObj)->Value, iCtrl3, iCtrl2 );
        pObj->Value = Gia_ManHashMux( pNew, Gia_ObjFanin1(pObj)->Value, iMuxB,  iMuxA );
    }
    assert( iFuncVars == Vec_IntSize(vMap) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    assert( Gia_ManPiNum(pNew) == Gia_ManCiNum(p) + 4 * Gia_ManAndNum(p) );
    return pNew;
}